

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCRetime(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vControls;
  void **ppvVar7;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pObj;
  char *pName;
  Abc_Ntk_t *pNtkNew;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  Vec_Int_t *vFlopClassesNew;
  uint local_64;
  uint local_60;
  uint local_5c;
  Vec_Int_t *local_38;
  
  pNtk_00 = Abc_NtkDup(pNtk);
  vControls = (Vec_Ptr_t *)malloc(0x10);
  vControls->nCap = 100;
  vControls->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vControls->pArray = ppvVar7;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar8 = (int *)malloc(400);
  p->pArray = piVar8;
  pVVar9 = pNtk_00->vBoxes;
  if (pVVar9->nSize < 1) {
    local_5c = 0;
    local_64 = 0;
    local_60 = 0;
    uVar12 = 0;
  }
  else {
    lVar14 = 0;
    uVar12 = 0;
    local_60 = 0;
    local_64 = 0;
    local_5c = 0;
    do {
      plVar3 = (long *)pVVar9->pArray[lVar14];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        lVar13 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
        plVar4 = *(long **)(lVar13 + (long)*(int *)plVar3[4] * 8);
        pAVar5 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        if ((pAVar5->vFanins).nSize == 3) {
          pvVar6 = *(void **)(lVar13 + (long)*(int *)plVar3[6] * 8);
          piVar8 = (pAVar5->vFanins).pArray;
          ppvVar7 = pAVar5->pNtk->vObjs->pArray;
          if (ppvVar7[piVar8[1]] == pvVar6) {
LAB_00856593:
            Vec_IntPush(p,-1);
            local_60 = local_60 + 1;
          }
          else if (ppvVar7[piVar8[2]] == pvVar6) {
            if (ppvVar7[piVar8[1]] == pvVar6) goto LAB_00856593;
            if (ppvVar7[piVar8[2]] != pvVar6) {
              __assert_fail("Abc_ObjFanin(pDriver, 2) == pFlopOut",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLatch.c"
                            ,0x2aa,"Abc_Ntk_t *Abc_NtkCRetime(Abc_Ntk_t *, int)");
            }
            pvVar6 = ppvVar7[*piVar8];
            uVar1 = vControls->nSize;
            lVar13 = (long)(int)uVar1;
            if (0 < lVar13) {
              lVar10 = 0;
              do {
                if (vControls->pArray[lVar10] == pvVar6) goto LAB_00856604;
                lVar10 = lVar10 + 1;
              } while (lVar13 != lVar10);
            }
            uVar2 = vControls->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vControls->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vControls->pArray,0x80);
                }
                iVar11 = 0x10;
              }
              else {
                iVar11 = uVar2 * 2;
                if (iVar11 <= (int)uVar2) goto LAB_008565f4;
                if (vControls->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(vControls->pArray,(ulong)uVar2 << 4);
                }
              }
              vControls->pArray = ppvVar7;
              vControls->nCap = iVar11;
            }
LAB_008565f4:
            vControls->nSize = uVar1 + 1;
            vControls->pArray[lVar13] = pvVar6;
LAB_00856604:
            iVar11 = -1;
            if (0 < (long)vControls->nSize) {
              lVar13 = 0;
              do {
                if (vControls->pArray[lVar13] ==
                    pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]) {
                  iVar11 = (int)lVar13;
                  break;
                }
                lVar13 = lVar13 + 1;
              } while (vControls->nSize != lVar13);
            }
            uVar12 = uVar12 + 1;
            Vec_IntPush(p,iVar11);
            Abc_ObjPatchFanin(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)plVar3[4] * 8),pAVar5,
                              (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[1]])
            ;
          }
          else {
            Vec_IntPush(p,-1);
            local_64 = local_64 + 1;
          }
        }
        else {
          Vec_IntPush(p,-1);
          local_5c = local_5c + 1;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar9 = pNtk_00->vBoxes;
    } while (lVar14 < pVVar9->nSize);
  }
  if (local_60 != 0) {
    printf("Opposite phase enable is present in %d flops (out of %d).\n",(ulong)local_60,
           (ulong)(uint)pNtk_00->nObjCounts[8]);
  }
  if (fVerbose != 0) {
    printf("CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n",(ulong)local_5c,
           (ulong)local_64,(ulong)local_60,(ulong)uVar12,(ulong)(uint)vControls->nSize);
  }
  iVar11 = vControls->nSize;
  if (0 < (long)iVar11) {
    ppvVar7 = vControls->pArray;
    lVar14 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)ppvVar7[lVar14];
      pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
      Abc_ObjAddFanin(pObj,pAVar5);
      pName = Abc_ObjName(pObj);
      Abc_ObjAssignName(pObj,pName,(char *)0x0);
      ppvVar7[lVar14] = pObj;
      lVar14 = lVar14 + 1;
    } while (iVar11 != lVar14);
  }
  Abc_NtkOrderCisCos(pNtk_00);
  Abc_NtkCleanup(pNtk_00,fVerbose);
  pNtkNew = Abc_NtkRetimeWithClassesNtk(pNtk_00,p,&local_38,fVerbose);
  Abc_NtkTransformBack(pNtk_00,pNtkNew,vControls,local_38);
  Abc_NtkDelete(pNtk_00);
  if (vControls->pArray != (void **)0x0) {
    free(vControls->pArray);
    vControls->pArray = (void **)0x0;
  }
  free(vControls);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
    local_38->pArray = (int *)0x0;
  }
  if (local_38 != (Vec_Int_t *)0x0) {
    free(local_38);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkCRetime( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vControls;
    Vec_Int_t * vFlopClasses, * vFlopClassesNew;
    Abc_Obj_t * pObj, * pDriver, * pFlopOut, * pObjPo;
    int i, iFlop, CountN = 0, Count2 = 0, Count1 = 0, Count0 = 0;

    // duplicate the AIG
    pNtk = Abc_NtkDup( pNtk );

    // update registers
    vControls    = Vec_PtrAlloc( 100 );
    vFlopClasses = Vec_IntAlloc( 100 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pFlopOut = Abc_ObjFanout0(pObj);
        pDriver = Abc_ObjFanin0( Abc_ObjFanin0(pObj) );
        if ( Abc_ObjFaninNum(pDriver) != 3 )
        {
            Vec_IntPush( vFlopClasses, -1 );
            CountN++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) != pFlopOut && Abc_ObjFanin(pDriver, 2) != pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count2++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) == pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count1++;
            continue;
        }
        assert( Abc_ObjFanin(pDriver, 2) == pFlopOut );
        Count0++;
        Vec_PtrPushUnique( vControls, Abc_ObjFanin0(pDriver) );
        // set the flop class
        iFlop = Vec_PtrFind( vControls, Abc_ObjFanin0(pDriver) );
        Vec_IntPush( vFlopClasses, iFlop );
        // update
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, Abc_ObjFanin(pDriver, 1) );
    }
    if ( Count1 )
        printf( "Opposite phase enable is present in %d flops (out of %d).\n", Count1, Abc_NtkLatchNum(pNtk) );
    if ( fVerbose )
    printf( "CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n", 
        CountN, Count2, Count1, Count0, Vec_PtrSize(vControls) );

    // add the controls to the list of POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pObjPo, pObj );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
        Vec_PtrWriteEntry( vControls, i, pObjPo );
    }
    Abc_NtkOrderCisCos( pNtk );
    Abc_NtkCleanup( pNtk, fVerbose );

    // performs retiming with classes
    pNtkNew = Abc_NtkRetimeWithClassesNtk( pNtk, vFlopClasses, &vFlopClassesNew, fVerbose );
    Abc_NtkTransformBack( pNtk, pNtkNew, vControls, vFlopClassesNew );
//    assert( Abc_NtkPoNum(pNtkNew) == Abc_NtkPoNum(pNtk) );
    Abc_NtkDelete( pNtk );

    Vec_PtrFree( vControls );
//    Vec_IntFree( vFlopClasses );
    Vec_IntFree( vFlopClassesNew );
    return pNtkNew;
}